

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

JsErrorCode
WScriptJsrt::FetchImportedModuleHelper
          (JsModuleRecord referencingModule,JsValueRef specifier,
          JsModuleRecord *dependentModuleRecord,LPCSTR refdir)

{
  undefined8 uVar1;
  bool bVar2;
  JsErrorCode JVar3;
  char *pcVar4;
  pointer ppVar5;
  mapped_type *fullDirNarrow;
  mapped_type *ppvVar6;
  mapped_type *pmVar7;
  ModuleMessage *message;
  char *local_230;
  ModuleMessage *moduleMessage;
  string local_200 [8];
  string pathKey;
  iterator iStack_1d8;
  JsErrorCode errorCode;
  allocator local_1c9;
  string local_1c8 [32];
  _Self local_1a8;
  iterator moduleEntry;
  string local_198 [8];
  string specifierFullPath;
  char local_178 [8];
  char fullPath [260];
  undefined1 local_58 [8];
  AutoString specifierStr;
  JsModuleRecord moduleRecord;
  LPCSTR refdir_local;
  JsModuleRecord *dependentModuleRecord_local;
  JsValueRef specifier_local;
  JsModuleRecord referencingModule_local;
  
  specifierStr.errorCode = JsNoError;
  specifierStr.dontFree = false;
  specifierStr._29_3_ = 0;
  AutoString::AutoString((AutoString *)local_58);
  *dependentModuleRecord = (JsModuleRecord)0x0;
  JVar3 = AutoString::Initialize((AutoString *)local_58,specifier);
  if (JVar3 != JsNoError) {
    referencingModule_local._4_4_ = AutoString::GetError((AutoString *)local_58);
    goto LAB_0011b694;
  }
  local_230 = refdir;
  if (refdir == (LPCSTR)0x0) {
    local_230 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,local_230,(allocator *)((long)&moduleEntry._M_node + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&moduleEntry._M_node + 7));
  pcVar4 = AutoString::operator*((AutoString *)local_58);
  std::__cxx11::string::operator+=(local_198,pcVar4);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  pcVar4 = _fullpath(local_178,pcVar4,0x104);
  if (pcVar4 == (char *)0x0) {
    referencingModule_local._4_4_ = JsErrorInvalidArgument;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c8,local_178,&local_1c9);
    local_1a8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
         ::find(&moduleRecordMap_abi_cxx11_,(key_type *)local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    iStack_1d8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                 ::end(&moduleRecordMap_abi_cxx11_);
    bVar2 = std::operator!=(&local_1a8,&stack0xfffffffffffffe28);
    if (bVar2) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>
               ::operator->(&local_1a8);
      *dependentModuleRecord = ppVar5->second;
      referencingModule_local._4_4_ = JsNoError;
    }
    else {
      JVar3 = ChakraRTInterface::JsInitializeModuleRecord
                        (referencingModule,specifier,(JsModuleRecord *)&specifierStr.errorCode);
      if (JVar3 == JsNoError) {
        fullDirNarrow =
             std::
             map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&moduleDirMap_abi_cxx11_,(key_type *)&specifierStr.errorCode);
        GetDir(local_178,fullDirNarrow);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_200,local_178,(allocator *)((long)&moduleMessage + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&moduleMessage + 7));
        uVar1 = specifierStr._24_8_;
        ppvVar6 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                  ::operator[](&moduleRecordMap_abi_cxx11_,(key_type *)local_200);
        *ppvVar6 = (mapped_type)uVar1;
        pmVar7 = std::
                 map<void_*,_ModuleState,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
                 ::operator[](&moduleErrMap,(key_type *)&specifierStr.errorCode);
        *pmVar7 = ImportedModule;
        message = ModuleMessage::Create(referencingModule,specifier,(string *)local_200);
        if (message != (ModuleMessage *)0x0) {
          PushMessage(&message->super_MessageBase);
          *dependentModuleRecord = (JsModuleRecord)specifierStr._24_8_;
        }
        else {
          referencingModule_local._4_4_ = JsErrorOutOfMemory;
        }
        std::__cxx11::string::~string(local_200);
        if (message == (ModuleMessage *)0x0) goto LAB_0011b678;
      }
      referencingModule_local._4_4_ = JVar3;
    }
  }
LAB_0011b678:
  std::__cxx11::string::~string(local_198);
LAB_0011b694:
  AutoString::~AutoString((AutoString *)local_58);
  return referencingModule_local._4_4_;
}

Assistant:

JsErrorCode WScriptJsrt::FetchImportedModuleHelper(JsModuleRecord referencingModule,
    JsValueRef specifier, __out JsModuleRecord* dependentModuleRecord, LPCSTR refdir)
{
    JsModuleRecord moduleRecord = JS_INVALID_REFERENCE;
    AutoString specifierStr;
    *dependentModuleRecord = nullptr;

    if (specifierStr.Initialize(specifier) != JsNoError)
    {
        return specifierStr.GetError();
    }

    char fullPath[_MAX_PATH];
    std::string specifierFullPath = refdir ? refdir : "";
    specifierFullPath += *specifierStr;
    if (_fullpath(fullPath, specifierFullPath.c_str(), _MAX_PATH) == nullptr)
    {
        return JsErrorInvalidArgument;
    }

    auto moduleEntry = moduleRecordMap.find(std::string(fullPath));
    if (moduleEntry != moduleRecordMap.end())
    {
        *dependentModuleRecord = moduleEntry->second;
        return JsNoError;
    }

    JsErrorCode errorCode = ChakraRTInterface::JsInitializeModuleRecord(referencingModule, specifier, &moduleRecord);
    if (errorCode == JsNoError)
    {
        GetDir(fullPath, &moduleDirMap[moduleRecord]);
        std::string pathKey = std::string(fullPath);
        moduleRecordMap[pathKey] = moduleRecord;
        moduleErrMap[moduleRecord] = ImportedModule;
        ModuleMessage* moduleMessage = WScriptJsrt::ModuleMessage::Create(referencingModule, specifier, &pathKey);
        if (moduleMessage == nullptr)
        {
            return JsErrorOutOfMemory;
        }
        WScriptJsrt::PushMessage(moduleMessage);
        *dependentModuleRecord = moduleRecord;
    }
    return errorCode;
}